

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Truck.cpp
# Opt level: O0

Truck * __thiscall Truck::getPlate_abi_cxx11_(Truck *this)

{
  long in_RSI;
  Truck *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 8));
  return this;
}

Assistant:

string Truck::getPlate() const {
    return plate;
}